

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

void __thiscall
Diligent::SerializedData::SerializedData
          (SerializedData *this,size_t Size,IMemoryAllocator *Allocator)

{
  int iVar1;
  IMemoryAllocator *pIVar2;
  undefined4 extraout_var;
  void *__s;
  
  pIVar2 = Allocator;
  if (Size == 0) {
    pIVar2 = (IMemoryAllocator *)0x0;
  }
  this->m_pAllocator = pIVar2;
  if (Size == 0) {
    __s = (void *)0x0;
  }
  else {
    iVar1 = (**Allocator->_vptr_IMemoryAllocator)
                      (Allocator,Size,"Serialized data memory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/Serializer.cpp"
                       ,0x29);
    __s = (void *)CONCAT44(extraout_var,iVar1);
  }
  this->m_Ptr = __s;
  this->m_Size = Size;
  (this->m_Hash).super___atomic_base<unsigned_long>._M_i = 0;
  memset(__s,0,Size);
  return;
}

Assistant:

SerializedData::SerializedData(size_t Size, IMemoryAllocator& Allocator) noexcept :
    m_pAllocator{Size > 0 ? &Allocator : nullptr},
    m_Ptr{Size > 0 ? Allocator.Allocate(Size, "Serialized data memory", __FILE__, __LINE__) : nullptr},
    m_Size{Size}
{
    // We need to zero out memory as due to element alignment, there may be gaps
    // in the data that will be filled with garbage, which will result in
    // operator==() and GetHash() returning invalid values.
    std::memset(m_Ptr, 0, m_Size);
}